

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
::shape(BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
        *this,size_t j)

{
  size_t sVar1;
  size_t sVar2;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  *pBVar3;
  
  sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(this->e1_);
  sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  pBVar3 = (BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
            *)&this->e2_;
  if (sVar2 <= sVar1) {
    pBVar3 = this;
  }
  sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::shape(pBVar3->e1_,j);
  return sVar1;
}

Assistant:

const std::size_t shape(const std::size_t j) const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shape(j) : e1_.shape(j); }